

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O2

const_iterator __thiscall
burst::k_ary_search_set<int,_std::less<void>_>::find_impl
          (k_ary_search_set<int,_std::less<void>_> *this,value_type_conflict2 *value)

{
  pointer piVar1;
  int *piVar2;
  long lVar3;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  long lVar5;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    piVar1 = (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->m_values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)piVar2 - (long)piVar1 >> 2) <= uVar6) {
      return (const_iterator)piVar2;
    }
    piVar1 = piVar1 + uVar6;
    lVar5 = this->m_arity - 1;
    lVar3 = (long)piVar2 - (long)piVar1 >> 2;
    if (lVar5 <= lVar3) {
      lVar3 = lVar5;
    }
    _Var4 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__ops::_Iter_comp_val<std::less<void>>>
                      (piVar1,piVar1 + lVar3,value);
    if ((_Var4._M_current != piVar1 + lVar3) && (*_Var4._M_current <= *value)) break;
    uVar6 = uVar6 * this->m_arity +
            (this->m_arity - 1) * (((long)_Var4._M_current - (long)piVar1 >> 2) + 1);
  }
  return (const_iterator)_Var4._M_current;
}

Assistant:

const_iterator find_impl (const value_type & value) const
        {
            std::size_t node_index = 0;

            while (node_index < m_values.size())
            {
                const_iterator node_begin = begin() + static_cast<difference_type>(node_index);
                const_iterator node_end =
                    node_begin +
                    std::min
                    (
                        static_cast<difference_type>(m_arity - 1),
                        std::distance(node_begin, end())
                    );

                const_iterator search_result =
                    std::lower_bound(node_begin, node_end, value, m_compare);
                if (search_result != node_end && not m_compare(value, *search_result))
                {
                    return search_result;
                }
                else
                {
                    node_index = perfect_tree_child_index
                    (
                        m_arity,
                        node_index,
                        static_cast<std::size_t>(std::distance(node_begin, search_result))
                    );
                }
            }

            return end();
        }